

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestHugeFieldNumbersLite::SharedDtor(MessageLite *self)

{
  ForeignMessageLite *this;
  TestHugeFieldNumbersLite_OptionalGroup *this_00;
  bool bVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  TestHugeFieldNumbersLite *local_18;
  TestHugeFieldNumbersLite *this_;
  MessageLite *self_local;
  
  local_18 = (TestHugeFieldNumbersLite *)self;
  this_ = (TestHugeFieldNumbersLite *)self;
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  pAVar2 = google::protobuf::MessageLite::GetArena(&local_18->super_MessageLite);
  if (pAVar2 != (Arena *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x2917,"this_.GetArena() == nullptr");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  google::protobuf::internal::ArenaStringPtr::Destroy(&(local_18->field_0)._impl_.optional_string_);
  google::protobuf::internal::ArenaStringPtr::Destroy(&(local_18->field_0)._impl_.optional_bytes_);
  this = *(ForeignMessageLite **)((long)&local_18->field_0 + 0x78);
  if (this != (ForeignMessageLite *)0x0) {
    ForeignMessageLite::~ForeignMessageLite(this);
    operator_delete(this,0x20);
  }
  this_00 = *(TestHugeFieldNumbersLite_OptionalGroup **)((long)&local_18->field_0 + 0x80);
  if (this_00 != (TestHugeFieldNumbersLite_OptionalGroup *)0x0) {
    TestHugeFieldNumbersLite_OptionalGroup::~TestHugeFieldNumbersLite_OptionalGroup(this_00);
    operator_delete(this_00,0x20);
  }
  bVar1 = has_oneof_field(local_18);
  if (bVar1) {
    clear_oneof_field(local_18);
  }
  Impl_::~Impl_(&(local_18->field_0)._impl_);
  return;
}

Assistant:

inline void TestHugeFieldNumbersLite::SharedDtor(MessageLite& self) {
  TestHugeFieldNumbersLite& this_ = static_cast<TestHugeFieldNumbersLite&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.optional_string_.Destroy();
  this_._impl_.optional_bytes_.Destroy();
  delete this_._impl_.optional_message_;
  delete this_._impl_.optionalgroup_;
  if (this_.has_oneof_field()) {
    this_.clear_oneof_field();
  }
  this_._impl_.~Impl_();
}